

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

void render_html_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  MD_OFFSET off;
  MD_OFFSET beg;
  MD_CHAR *in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe0;
  byte bVar2;
  byte bVar3;
  uint local_18;
  
  local_18 = 0;
  uVar1 = local_18;
  while( true ) {
    while( true ) {
      bVar3 = 0;
      if ((((uVar1 + 3 < in_EDX) &&
           (bVar3 = 0, (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)uVar1)) & 1) == 0
           )) && (bVar3 = 0,
                 (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)(uVar1 + 1))) & 1) == 0
                 )) &&
         (bVar3 = 0,
         (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)(uVar1 + 2))) & 1) == 0)) {
        bVar3 = (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)(uVar1 + 3))) & 1) != 0
                ^ 0xff;
      }
      if ((bVar3 & 1) == 0) break;
      uVar1 = uVar1 + 4;
    }
    while( true ) {
      bVar2 = 0;
      if (uVar1 < in_EDX) {
        bVar2 = (*(byte *)(in_RDI + 0x18 + (ulong)*(byte *)(in_RSI + (ulong)uVar1)) & 1) != 0 ^ 0xff
        ;
      }
      if ((bVar2 & 1) == 0) break;
      uVar1 = uVar1 + 1;
    }
    if (local_18 < uVar1) {
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(bVar3,CONCAT12(bVar2,in_stack_ffffffffffffffe0))),
                      in_stack_ffffffffffffffd8,0);
    }
    if (in_EDX <= uVar1) break;
    in_stack_ffffffffffffffd8 = (MD_CHAR *)(ulong)((int)*(char *)(in_RSI + (ulong)uVar1) - 0x22);
    switch(in_stack_ffffffffffffffd8) {
    case (MD_CHAR *)0x0:
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(bVar3,CONCAT12(bVar2,in_stack_ffffffffffffffe0))),
                      in_stack_ffffffffffffffd8,0);
      break;
    case (MD_CHAR *)0x4:
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(bVar3,CONCAT12(bVar2,in_stack_ffffffffffffffe0))),
                      in_stack_ffffffffffffffd8,0);
      break;
    case (MD_CHAR *)0x1a:
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(bVar3,CONCAT12(bVar2,in_stack_ffffffffffffffe0))),
                      in_stack_ffffffffffffffd8,0);
      break;
    case (MD_CHAR *)0x1c:
      render_verbatim((MD_HTML *)
                      CONCAT44(uVar1,CONCAT13(bVar3,CONCAT12(bVar2,in_stack_ffffffffffffffe0))),
                      in_stack_ffffffffffffffd8,0);
    }
    uVar1 = uVar1 + 1;
    local_18 = uVar1;
  }
  return;
}

Assistant:

static void
render_html_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in normal HTML text. */
    #define NEED_HTML_ESC(ch)   (r->escape_map[(unsigned char)(ch)] & NEED_HTML_ESC_FLAG)

    while(1) {
        /* Optimization: Use some loop unrolling. */
        while(off + 3 < size  &&  !NEED_HTML_ESC(data[off+0])  &&  !NEED_HTML_ESC(data[off+1])
                              &&  !NEED_HTML_ESC(data[off+2])  &&  !NEED_HTML_ESC(data[off+3]))
            off += 4;
        while(off < size  &&  !NEED_HTML_ESC(data[off]))
            off++;

        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                case '<':   RENDER_VERBATIM(r, "&lt;"); break;
                case '>':   RENDER_VERBATIM(r, "&gt;"); break;
                case '"':   RENDER_VERBATIM(r, "&quot;"); break;
            }
            off++;
        } else {
            break;
        }
        beg = off;
    }
}